

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

void __thiscall bloaty::Bloaty::Bloaty(Bloaty *this,InputFileFactory *factory,Options *options)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  Options *unaff_retaddr;
  DataSourceDefinition (*in_stack_00000008) [10];
  Bloaty *in_stack_00000010;
  Options *in_stack_00000058;
  
  *in_RDI = in_RSI;
  Options::Options(options,in_stack_00000058);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::ConfiguredDataSource,_std::default_delete<bloaty::ConfiguredDataSource>_>_>_>_>
         *)0x19bded);
  std::vector<bloaty::ConfiguredDataSource_*,_std::allocator<bloaty::ConfiguredDataSource_*>_>::
  vector((vector<bloaty::ConfiguredDataSource_*,_std::allocator<bloaty::ConfiguredDataSource_*>_> *)
         0x19be03);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x19be19);
  std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>::vector
            ((vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
              *)0x19be2f);
  std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>::vector
            ((vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>
              *)0x19be45);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x19be5b);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x19be71);
  std::make_unique<google::protobuf::Arena>();
  AddBuiltInSources<10ul>(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  return;
}

Assistant:

Bloaty::Bloaty(const InputFileFactory& factory, const Options& options)
    : file_factory_(factory),
      options_(options),
      arena_(std::make_unique<google::protobuf::Arena>()) {
  AddBuiltInSources(data_sources, options);
}